

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Uint64(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,uint64_t i)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  
  this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)(this->stack_).stackTop_;
  if ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
       *)(this->stack_).stackEnd_ < this_00 + 1) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
    this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = (char *)(this_00 + 1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(this_00,i);
  return true;
}

Assistant:

bool Uint64(uint64_t i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }